

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

void __thiscall cs::statement_try::run_impl(statement_try *this)

{
  context_t *pcVar1;
  element_type *peVar2;
  stack_pointer psVar3;
  _Elt_pointer ppsVar4;
  statement_base *psVar5;
  undefined *puVar6;
  _Map_pointer pppsVar7;
  stack_pointer this_00;
  _Elt_pointer ppsVar8;
  _Elt_pointer ppsVar9;
  scope_guard scope;
  scope_guard local_f8 [25];
  
  cs_debugger_step_callback(&this->super_statement_base);
  pcVar1 = &(this->super_statement_base).context;
  peVar2 = (((this->super_statement_base).context.
             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
           super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar3 = *(peVar2->super_runtime_type).storage.fiber_stack;
  this_00 = &(peVar2->super_runtime_type).storage.m_data;
  if (psVar3 != (stack_pointer)0x0) {
    this_00 = psVar3;
  }
  local_f8[0].context = pcVar1;
  stack_type<cs::domain_type,_std::allocator>::push<>(this_00);
  ppsVar9 = (this->mTryBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar4 = (this->mTryBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppsVar9 != ppsVar4) {
    ppsVar8 = (this->mTryBody).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar7 = (this->mTryBody).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      puVar6 = current_process;
      psVar5 = *ppsVar9;
      if ((*current_process & 1) != 0) {
        LOCK();
        *current_process = 0;
        UNLOCK();
        event_type::touch((event_type *)(puVar6 + 0xf8),(void *)0x0);
      }
      (*psVar5->_vptr_statement_base[3])(psVar5);
      peVar2 = (((pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (((peVar2->return_fcall != false) || (peVar2->break_block != false)) ||
         (peVar2->continue_block != false)) break;
      ppsVar9 = ppsVar9 + 1;
      if (ppsVar9 == ppsVar8) {
        ppsVar9 = pppsVar7[1];
        pppsVar7 = pppsVar7 + 1;
        ppsVar8 = ppsVar9 + 0x40;
      }
    } while (ppsVar9 != ppsVar4);
  }
  scope_guard::~scope_guard(local_f8);
  return;
}

Assistant:

void statement_try::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		scope_guard scope(context);
		for (auto &ptr: mTryBody) {
			try {
				ptr->run();
			}
			catch (const lang_error &le) {
				scope.reset();
				context->instance->storage.add_var_no_return(mName, le);
				for (auto &ptr: mCatchBody) {
					try {
						ptr->run();
					}
					catch (const cs::exception &e) {
						throw e;
					}
					catch (const std::exception &e) {
						throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
					}
					if (context->instance->return_fcall || context->instance->break_block ||
					        context->instance->continue_block)
						break;
				}
				return;
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
			}
			if (context->instance->return_fcall || context->instance->break_block || context->instance->continue_block)
				break;
		}
	}